

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecMem.h
# Opt level: O2

int Vec_MemHashInsert(Vec_Mem_t *p,word *pEntry)

{
  uint i;
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  word *pwVar4;
  int *piVar5;
  word **ppwVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  
  pVVar1 = p->vTable;
  iVar2 = pVVar1->nSize;
  if (iVar2 < p->nEntries) {
    iVar2 = Abc_PrimeCudd(iVar2 * 2);
    Vec_IntFill(pVVar1,iVar2,-1);
    p->vNexts->nSize = 0;
    for (iVar2 = 0; iVar3 = p->nEntries, iVar2 < iVar3; iVar2 = iVar2 + 1) {
      pwVar4 = Vec_MemReadEntry(p,iVar2);
      if (pwVar4 == (word *)0x0) {
        iVar3 = p->nEntries;
        break;
      }
      piVar5 = Vec_MemHashLookup(p,pwVar4);
      if (*piVar5 != -1) {
        __assert_fail("*pSpot == -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecMem.h"
                      ,0x161,"void Vec_MemHashResize(Vec_Mem_t *)");
      }
      pVVar1 = p->vNexts;
      *piVar5 = pVVar1->nSize;
      Vec_IntPush(pVVar1,-1);
    }
    if (iVar3 != p->vNexts->nSize) {
      __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecMem.h"
                    ,0x165,"void Vec_MemHashResize(Vec_Mem_t *)");
    }
  }
  piVar5 = Vec_MemHashLookup(p,pEntry);
  iVar2 = *piVar5;
  if (iVar2 == -1) {
    pVVar1 = p->vNexts;
    *piVar5 = pVVar1->nSize;
    Vec_IntPush(pVVar1,-1);
    i = p->nEntries;
    if ((int)i < 0) {
      __assert_fail("i >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecMem.h"
                    ,0xd8,"word *Vec_MemGetEntry(Vec_Mem_t *, int)");
    }
    uVar9 = i >> ((byte)p->LogPageSze & 0x1f);
    iVar2 = p->iPage;
    if (iVar2 < (int)uVar9) {
      iVar3 = p->nPageAlloc;
      if (iVar3 <= (int)uVar9) {
        iVar7 = uVar9 + 0x20;
        if (iVar3 != 0) {
          iVar7 = iVar3 * 2;
        }
        p->nPageAlloc = iVar7;
        if (p->ppPages == (word **)0x0) {
          ppwVar6 = (word **)malloc((long)iVar7 * 8);
        }
        else {
          ppwVar6 = (word **)realloc(p->ppPages,(long)iVar7 * 8);
          iVar2 = p->iPage;
        }
        p->ppPages = ppwVar6;
      }
      for (lVar8 = (long)iVar2; lVar8 < (long)(ulong)uVar9; lVar8 = lVar8 + 1) {
        pwVar4 = (word *)malloc((long)(p->nEntrySize << ((byte)p->LogPageSze & 0x1f)) << 3);
        p->ppPages[lVar8 + 1] = pwVar4;
      }
      p->iPage = uVar9;
    }
    p->nEntries = i + 1;
    pwVar4 = Vec_MemReadEntry(p,i);
    memmove(pwVar4,pEntry,(long)p->nEntrySize << 3);
    if (p->nEntries != p->vNexts->nSize) {
      __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecMem.h"
                    ,0x172,"int Vec_MemHashInsert(Vec_Mem_t *, word *)");
    }
    iVar2 = p->nEntries + -1;
  }
  return iVar2;
}

Assistant:

static int Vec_MemHashInsert( Vec_Mem_t * p, word * pEntry )
{
    int * pSpot;
    if ( p->nEntries > Vec_IntSize(p->vTable) )
        Vec_MemHashResize( p );
    pSpot = Vec_MemHashLookup( p, pEntry );
    if ( *pSpot != -1 )
        return *pSpot;
    *pSpot = Vec_IntSize(p->vNexts);
    Vec_IntPush( p->vNexts, -1 );
    Vec_MemPush( p, pEntry );
    assert( p->nEntries == Vec_IntSize(p->vNexts) );
    return Vec_IntSize(p->vNexts) - 1;
}